

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::insertYorder(Collimator *this,double y)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  double *pdVar3;
  long lVar4;
  int j;
  ulong uVar5;
  bool bVar6;
  double local_38;
  
  this_00 = &this->ycoord;
  local_38 = y;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_38);
  pdVar3 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = _Var2._M_current != pdVar3;
  lVar4 = 0;
  uVar5 = 0;
  while ((pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start,
         uVar5 < (ulong)((long)pdVar3 - (long)pdVar1 >> 3) && (!bVar6))) {
    bVar6 = local_38 < *(double *)((long)pdVar1 + lVar4);
    if (local_38 < *(double *)((long)pdVar1 + lVar4)) {
      std::vector<double,_std::allocator<double>_>::insert
                (this_00,(double *)((long)pdVar1 + lVar4),&local_38);
      pdVar3 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 8;
  }
  if (!bVar6) {
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_38);
  }
  return;
}

Assistant:

void Collimator::insertYorder(double y) {
    bool flag=false;
    if (find(ycoord.begin(), ycoord.end(), y) != ycoord.end())
      flag=true;
    for (int j=0; j< ycoord.size() && !flag; j++) {
      if (ycoord[j] > y) {
        ycoord.insert(ycoord.begin()+j, y);
        flag=true;
      }
    }
    if (!flag) ycoord.push_back(y);
  }